

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aecm_core.cc
# Opt level: O3

void WebRtcAecm_CalcEnergies
               (AecmCore *aecm,uint16_t *far_spectrum,int16_t far_q,uint32_t nearEner,
               int32_t *echoEst)

{
  short sVar1;
  short sVar2;
  int16_t *piVar3;
  bool bVar4;
  int16_t iVar5;
  ushort uVar6;
  int16_t iVar7;
  short sVar8;
  long lVar9;
  undefined6 in_register_00000012;
  ushort uVar10;
  uint uVar11;
  int iVar12;
  uint32_t tmpStored;
  uint32_t tmpAdapt;
  uint32_t tmpFar;
  uint32_t local_3c;
  uint32_t local_38;
  uint32_t local_34;
  
  local_38 = 0;
  local_3c = 0;
  local_34 = 0;
  memmove(aecm->nearLogEnergy + 1,aecm->nearLogEnergy,0x7e);
  iVar5 = LogOfEnergyInQ8(nearEner,(int)aecm->dfaNoisyQDomain);
  aecm->nearLogEnergy[0] = iVar5;
  (*WebRtcAecm_CalcLinearEnergies)(aecm,far_spectrum,echoEst,&local_34,&local_38,&local_3c);
  memmove(aecm->echoAdaptLogEnergy + 1,aecm->echoAdaptLogEnergy,0x7e);
  memmove(aecm->echoStoredLogEnergy + 1,aecm->echoStoredLogEnergy,0x7e);
  iVar12 = (int)CONCAT62(in_register_00000012,far_q);
  uVar6 = LogOfEnergyInQ8(local_34,iVar12);
  aecm->farLogEnergy = uVar6;
  iVar12 = iVar12 + 0xc;
  iVar5 = LogOfEnergyInQ8(local_38,iVar12);
  aecm->echoAdaptLogEnergy[0] = iVar5;
  iVar7 = LogOfEnergyInQ8(local_3c,iVar12);
  aecm->echoStoredLogEnergy[0] = iVar7;
  if ((short)uVar6 < 0x402) {
    uVar10 = aecm->farEnergyVAD;
  }
  else {
    uVar11 = (uint)uVar6;
    sVar1 = aecm->startupState;
    bVar4 = sVar1 != 0;
    sVar2 = aecm->farEnergyMin;
    iVar12 = (int)sVar2;
    if (1 < (ushort)(sVar2 + 0x8001U)) {
      if ((short)uVar6 < sVar2) {
        uVar11 = iVar12 - ((int)(iVar12 - (uint)uVar6) >> (sVar1 == 0 ^ 3U));
      }
      else {
        uVar11 = ((int)((uint)uVar6 - iVar12) >> bVar4 * '\x03' + 8) + iVar12;
      }
    }
    sVar8 = (short)uVar11;
    aecm->farEnergyMin = sVar8;
    sVar2 = aecm->farEnergyMax;
    uVar10 = uVar6;
    if (1 < (ushort)(sVar2 + 0x8001U)) {
      if ((short)uVar6 < sVar2) {
        uVar10 = sVar2 - (short)((int)sVar2 - (uint)uVar6 >> 0xb);
      }
      else {
        uVar10 = (short)((int)((uint)uVar6 - (int)sVar2) >> bVar4 * '\x02' + 2) + sVar2;
      }
    }
    aecm->farEnergyMax = uVar10;
    aecm->farEnergyMaxMin = uVar10 - sVar8;
    iVar12 = ((0xa00 - uVar11 & 0xffff) * 0xe6 >> 9) + 0xe6;
    if ((short)(0xa00 - uVar11) < 1) {
      iVar12 = 0xe6;
    }
    if (sVar1 == 0 || 0x400 < aecm->vadUpdateCount) {
      uVar10 = sVar8 + (short)iVar12;
      aecm->farEnergyVAD = uVar10;
    }
    else {
      uVar10 = aecm->farEnergyVAD;
      if ((short)uVar6 < (short)uVar10) {
        uVar10 = uVar10 + (short)((iVar12 + (uint)uVar6) - (uint)uVar10 >> 6);
        aecm->farEnergyVAD = uVar10;
        aecm->vadUpdateCount = 0;
      }
      else {
        aecm->vadUpdateCount = aecm->vadUpdateCount + 1;
      }
    }
    aecm->farEnergyMSE = uVar10 + 0x100;
  }
  if ((short)uVar10 < (short)uVar6) {
    if ((aecm->startupState == 0) || (0x3a1 < aecm->farEnergyMaxMin)) {
      aecm->currentVADValue = 1;
    }
    else if (aecm->currentVADValue == 0) {
      return;
    }
    if ((aecm->firstVAD != 0) && (aecm->firstVAD = 0, aecm->nearLogEnergy[0] < iVar5)) {
      piVar3 = aecm->channelAdapt16;
      lVar9 = 0;
      do {
        piVar3[lVar9] = piVar3[lVar9] >> 3;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x41);
      aecm->echoAdaptLogEnergy[0] = aecm->echoAdaptLogEnergy[0] + -0x300;
      aecm->firstVAD = 1;
    }
  }
  else {
    aecm->currentVADValue = 0;
  }
  return;
}

Assistant:

void WebRtcAecm_CalcEnergies(AecmCore* aecm,
                             const uint16_t* far_spectrum,
                             const int16_t far_q,
                             const uint32_t nearEner,
                             int32_t* echoEst) {
    // Local variables
    uint32_t tmpAdapt = 0;
    uint32_t tmpStored = 0;
    uint32_t tmpFar = 0;

    int i;

    int16_t tmp16;
    int16_t increase_max_shifts = 4;
    int16_t decrease_max_shifts = 11;
    int16_t increase_min_shifts = 11;
    int16_t decrease_min_shifts = 3;

    // Get log of near end energy and store in buffer

    // Shift buffer
    memmove(aecm->nearLogEnergy + 1, aecm->nearLogEnergy,
            sizeof(int16_t) * (MAX_BUF_LEN - 1));

    // Logarithm of integrated magnitude spectrum (nearEner)
    aecm->nearLogEnergy[0] = LogOfEnergyInQ8(nearEner, aecm->dfaNoisyQDomain);

    WebRtcAecm_CalcLinearEnergies(aecm, far_spectrum, echoEst, &tmpFar, &tmpAdapt, &tmpStored);

    // Shift buffers
    memmove(aecm->echoAdaptLogEnergy + 1, aecm->echoAdaptLogEnergy,
            sizeof(int16_t) * (MAX_BUF_LEN - 1));
    memmove(aecm->echoStoredLogEnergy + 1, aecm->echoStoredLogEnergy,
            sizeof(int16_t) * (MAX_BUF_LEN - 1));

    // Logarithm of delayed far end energy
    aecm->farLogEnergy = LogOfEnergyInQ8(tmpFar, far_q);

    // Logarithm of estimated echo energy through adapted channel
    aecm->echoAdaptLogEnergy[0] = LogOfEnergyInQ8(tmpAdapt,
                                                  RESOLUTION_CHANNEL16 + far_q);

    // Logarithm of estimated echo energy through stored channel
    aecm->echoStoredLogEnergy[0] =
        LogOfEnergyInQ8(tmpStored, RESOLUTION_CHANNEL16 + far_q);

    // Update farend energy levels (min, max, vad, mse)
    if (aecm->farLogEnergy > FAR_ENERGY_MIN)
    {
        if (aecm->startupState == 0)
        {
            increase_max_shifts = 2;
            decrease_min_shifts = 2;
            increase_min_shifts = 8;
        }

        aecm->farEnergyMin = WebRtcAecm_AsymFilt(aecm->farEnergyMin, aecm->farLogEnergy,
                                                 increase_min_shifts, decrease_min_shifts);
        aecm->farEnergyMax = WebRtcAecm_AsymFilt(aecm->farEnergyMax, aecm->farLogEnergy,
                                                 increase_max_shifts, decrease_max_shifts);
        aecm->farEnergyMaxMin = (aecm->farEnergyMax - aecm->farEnergyMin);

        // Dynamic VAD region size
        tmp16 = 2560 - aecm->farEnergyMin;
        if (tmp16 > 0)
        {
          tmp16 = (int16_t)((tmp16 * FAR_ENERGY_VAD_REGION) >> 9);
        } else
        {
            tmp16 = 0;
        }
        tmp16 += FAR_ENERGY_VAD_REGION;

        if ((aecm->startupState == 0) | (aecm->vadUpdateCount > 1024))
        {
            // In startup phase or VAD update halted
            aecm->farEnergyVAD = aecm->farEnergyMin + tmp16;
        } else
        {
            if (aecm->farEnergyVAD > aecm->farLogEnergy)
            {
                aecm->farEnergyVAD +=
                    (aecm->farLogEnergy + tmp16 - aecm->farEnergyVAD) >> 6;
                aecm->vadUpdateCount = 0;
            } else
            {
                aecm->vadUpdateCount++;
            }
        }
        // Put MSE threshold higher than VAD
        aecm->farEnergyMSE = aecm->farEnergyVAD + (1 << 8);
    }

    // Update VAD variables
    if (aecm->farLogEnergy > aecm->farEnergyVAD)
    {
        if ((aecm->startupState == 0) | (aecm->farEnergyMaxMin > FAR_ENERGY_DIFF))
        {
            // We are in startup or have significant dynamics in input speech level
            aecm->currentVADValue = 1;
        }
    } else
    {
        aecm->currentVADValue = 0;
    }
    if ((aecm->currentVADValue) && (aecm->firstVAD))
    {
        aecm->firstVAD = 0;
        if (aecm->echoAdaptLogEnergy[0] > aecm->nearLogEnergy[0])
        {
            // The estimated echo has higher energy than the near end signal.
            // This means that the initialization was too aggressive. Scale
            // down by a factor 8
            for (i = 0; i < PART_LEN1; i++)
            {
                aecm->channelAdapt16[i] >>= 3;
            }
            // Compensate the adapted echo energy level accordingly.
            aecm->echoAdaptLogEnergy[0] -= (3 << 8);
            aecm->firstVAD = 1;
        }
    }
}